

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::count_digits<1u>
          (int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>> *this)

{
  int num_digits;
  unsigned_type n;
  int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_> *this_local;
  
  n = *(unsigned_type *)(this + 0x10);
  num_digits = 0;
  do {
    num_digits = num_digits + 1;
    n = n >> 1;
  } while (n != 0);
  return num_digits;
}

Assistant:

int count_digits() const {
      unsigned_type n = abs_value;
      int num_digits = 0;
      do {
        ++num_digits;
      } while ((n >>= BITS) != 0);
      return num_digits;
    }